

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

Prefix * duckdb::Prefix::GetTail(Prefix *__return_storage_ptr__,ART *art,Node *node)

{
  Node *pNVar1;
  Prefix local_40;
  
  Prefix(__return_storage_ptr__,art,(Node)(node->super_IndexPointer).data,true,false);
  pNVar1 = __return_storage_ptr__->ptr;
  if (((pNVar1->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
    do {
      Prefix(&local_40,art,(Node)(pNVar1->super_IndexPointer).data,true,false);
      __return_storage_ptr__->in_memory = local_40.in_memory;
      __return_storage_ptr__->data = local_40.data;
      __return_storage_ptr__->ptr = local_40.ptr;
      pNVar1 = __return_storage_ptr__->ptr;
    } while (((pNVar1->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000);
  }
  return __return_storage_ptr__;
}

Assistant:

Prefix Prefix::GetTail(ART &art, const Node &node) {
	Prefix prefix(art, node, true);
	while (prefix.ptr->GetType() == PREFIX) {
		prefix = Prefix(art, *prefix.ptr, true);
	}
	return prefix;
}